

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseMisc(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlParserInputPtr pxVar2;
  
  if (ctxt->instate != XML_PARSER_EOF) {
    while( true ) {
      xmlSkipBlankChars(ctxt);
      pxVar2 = ctxt->input;
      if ((ctxt->progressive == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
        xmlGROW(ctxt);
        pxVar2 = ctxt->input;
      }
      pxVar1 = pxVar2->cur;
      if (*pxVar1 != '<') break;
      if (pxVar1[1] == '!') {
        if (pxVar1[2] != '-') {
          return;
        }
        if (pxVar1[3] != '-') {
          return;
        }
        xmlParseComment(ctxt);
      }
      else {
        if (pxVar1[1] != '?') {
          return;
        }
        xmlParsePI(ctxt);
      }
      if (ctxt->instate == XML_PARSER_EOF) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlParseMisc(xmlParserCtxtPtr ctxt) {
    while (ctxt->instate != XML_PARSER_EOF) {
        SKIP_BLANKS;
        GROW;
        if ((RAW == '<') && (NXT(1) == '?')) {
	    xmlParsePI(ctxt);
        } else if (CMP4(CUR_PTR, '<', '!', '-', '-')) {
	    xmlParseComment(ctxt);
        } else {
            break;
        }
    }
}